

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O3

void __thiscall kratos::StmtScopeVisitor::handle_stmt(StmtScopeVisitor *this,Stmt *stmt)

{
  map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pmVar1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  undefined4 extraout_var;
  iterator iVar5;
  VarStmt *pVVar6;
  const_iterator cVar7;
  _Rb_tree_node_base *p_Var8;
  InternalException *this_01;
  map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *pmVar9;
  map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *pmVar10;
  uint ln;
  Scope<std::nullptr_t> *scope;
  undefined1 local_e8 [8];
  Scope<std::nullptr_t> *stmt_scope;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  __node_base local_c8;
  size_type sStack_c0;
  float local_b8;
  size_t local_b0;
  _Alloc_hider _Stack_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  uint local_80;
  map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *local_78;
  Scope<std::nullptr_t> *local_70;
  undefined1 local_68 [8];
  string filename;
  Stmt *parent_stmt;
  Stmt *local_38;
  Stmt *stmt_local;
  
  local_68 = (undefined1  [8])&filename._M_string_length;
  filename._M_dataplus._M_p = (pointer)0x0;
  filename._M_string_length._0_1_ = 0;
  local_e8 = (undefined1  [8])&local_d8;
  local_38 = stmt;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"debug-ignore","");
  bVar2 = IRNode::has_attribute(&stmt->super_IRNode,(string *)local_e8);
  if (local_e8 != (undefined1  [8])&local_d8) {
    operator_delete((void *)local_e8,(ulong)(local_d8._M_allocated_capacity + 1));
  }
  if (!bVar2) {
    this_00 = this->stmt_fn_ln_;
    pmVar9 = *(map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
               **)(this_00 + 0x10);
    ln = 0;
    if (pmVar9 != (map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                   *)0x0) {
      pmVar10 = this_00 + 8;
      do {
        if (*(Stmt **)(pmVar9 + 0x20) >= local_38) {
          pmVar10 = pmVar9;
        }
        pmVar9 = *(map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                   **)(pmVar9 + (ulong)(*(Stmt **)(pmVar9 + 0x20) < local_38) * 8 + 0x10);
      } while (pmVar9 != (map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                          *)0x0);
      ln = 0;
      if ((pmVar10 != this_00 + 8) && (*(Stmt **)(pmVar10 + 0x20) <= local_38)) {
        pmVar4 = std::
                 map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                 ::at(this_00,&local_38);
        std::__cxx11::string::_M_assign((string *)local_68);
        ln = pmVar4->second;
      }
    }
    iVar3 = (*(local_38->super_IRNode)._vptr_IRNode[4])();
    filename.field_2._8_8_ = CONCAT44(extraout_var,iVar3);
    if (*(int *)(filename.field_2._8_8_ + 0x48) == 0) {
      filename.field_2._8_8_ =
           hgdb::json::Scope<hgdb::json::Module>::create_scope<hgdb::json::Scope<decltype(nullptr)>>
                     (&this->module_->super_Scope<hgdb::json::Module>);
      scope = (Scope<std::nullptr_t> *)filename.field_2._8_8_;
      if (filename._M_dataplus._M_p == (pointer)0x0) {
        local_78 = this->stmt_fn_ln_;
        local_d8._M_allocated_capacity = (size_type)&_Stack_a8;
        stmt_scope._0_4_ = 0;
        local_d8._8_8_ = 1;
        local_c8._M_nxt = (_Hash_node_base *)0x0;
        sStack_c0 = 0;
        local_b8 = 1.0;
        local_b0 = 0;
        _Stack_a8._M_p = (pointer)0x0;
        local_e8 = (undefined1  [8])&PTR_visit_root_002aa4f0;
        local_98 = 0;
        local_90 = 0;
        local_80 = 0;
        local_a0 = &local_90;
        local_70 = (Scope<std::nullptr_t> *)filename.field_2._8_8_;
        IRVisitor::visit_root((IRVisitor *)local_e8,&local_38->super_IRNode);
        std::__cxx11::string::_M_assign((string *)local_68);
        ln = local_80;
        local_e8 = (undefined1  [8])&PTR_visit_root_002aa4f0;
        if (local_a0 != &local_90) {
          operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
        }
        local_e8 = (undefined1  [8])&PTR_visit_root_002a82e0;
        std::
        _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&local_d8);
        scope = local_70;
      }
      std::__cxx11::string::_M_assign((string *)&scope->filename);
      std::
      _Hashtable<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>,std::allocator<std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt_const*>,std::hash<kratos::Stmt_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<kratos::Stmt*&,hgdb::json::Scope<decltype(nullptr)>*&>
                ((_Hashtable<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>,std::allocator<std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt_const*>,std::hash<kratos::Stmt_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->stmt_scope_mapping_,&local_38,(undefined1 *)((long)&filename.field_2 + 8)
                );
      if (local_38->type_ != Assign) goto LAB_001b1828;
    }
    else {
      iVar5 = std::
              _Hashtable<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->stmt_scope_mapping_)._M_h,(key_type *)((long)&filename.field_2 + 8));
      if (iVar5.
          super__Node_iterator_base<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>,_false>
          ._M_cur == (__node_type *)0x0) {
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        local_e8 = (undefined1  [8])&local_d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_e8,"Scope not properly created","");
        InternalException::InternalException(this_01,(string *)local_e8);
        __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar5 = std::
              _Hashtable<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->stmt_scope_mapping_)._M_h,(key_type *)((long)&filename.field_2 + 8));
      if (iVar5.
          super__Node_iterator_base<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>,_false>
          ._M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      scope = *(Scope<std::nullptr_t> **)
               ((long)iVar5.
                      super__Node_iterator_base<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>,_false>
                      ._M_cur + 0x10);
    }
    pmVar1 = &local_38->scope_context_;
    for (p_Var8 = (local_38->scope_context_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      pVVar6 = add_variable<true>(this,scope,(string *)(p_Var8 + 1),(string *)&p_Var8[2]._M_parent,
                                  SUB41(p_Var8[2]._M_color,0));
      if ((pVVar6 != (VarStmt *)0x0) &&
         (cVar7 = std::
                  _Hashtable<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&this->enable_conditions_->_M_h,&local_38),
         cVar7.
         super__Node_iterator_base<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
         ._M_cur != (__node_type *)0x0)) {
        cVar7 = std::
                _Hashtable<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&this->enable_conditions_->_M_h,&local_38);
        if (cVar7.
            super__Node_iterator_base<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
        }
        std::__cxx11::string::_M_assign
                  ((string *)&(pVVar6->super_Scope<hgdb::json::VarStmt>).condition);
      }
    }
    local_e8 = (undefined1  [8])add_stmt(this,scope,local_38,(string *)local_68,ln);
    if (local_e8 != (undefined1  [8])0x0) {
      std::
      _Hashtable<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>,std::allocator<std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt_const*>,std::hash<kratos::Stmt_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<kratos::Stmt*&,hgdb::json::Scope<decltype(nullptr)>*&>
                ((_Hashtable<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>,std::allocator<std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt_const*>,std::hash<kratos::Stmt_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->stmt_scope_mapping_,&local_38,local_e8);
    }
  }
LAB_001b1828:
  if (local_68 != (undefined1  [8])&filename._M_string_length) {
    operator_delete((void *)local_68,
                    CONCAT71(filename._M_string_length._1_7_,(undefined1)filename._M_string_length)
                    + 1);
  }
  return;
}

Assistant:

void handle_stmt(Stmt *stmt) {
        std::string filename;
        uint32_t ln = 0;

        if (stmt->has_attribute("debug-ignore")) return;

        if (stmt_fn_ln_.find(stmt) != stmt_fn_ln_.end()) {
            std::tie(filename, ln) = stmt_fn_ln_.at(stmt);
        }

        using namespace hgdb::json;
        auto *parent = stmt->parent();
        hgdb::json::Scope<> *parent_scope;
        if (parent->ir_node_kind() == IRNodeKind::GeneratorKind) {
            // this is top level
            auto *scope = module_.create_scope<Scope<>>();
            if (filename.empty()) {
                StmtFileNameVisitor v(stmt_fn_ln_);
                v.visit_root(stmt);
                filename = v.filename;
                ln = v.ln;
            }
            scope->filename = filename;
            parent_scope = scope;
            stmt_scope_mapping_.emplace(stmt, scope);

            if (stmt->type() != StatementType::Assign) {
                // only top level assign, i.e. continuous assignment can
                // have useful scope
                return;
            }

        } else {
            auto *parent_stmt = reinterpret_cast<Stmt *>(parent);
            if (stmt_scope_mapping_.find(parent_stmt) == stmt_scope_mapping_.end()) {
                throw InternalException("Scope not properly created");
            }
            parent_scope = stmt_scope_mapping_.at(parent_stmt);
        }

        // store all the context variables
        // TODO: use stack address as a way to determine the actual scope
        //  for now we flatten everything
        for (auto const &[name, value_pair] : stmt->scope_context()) {
            auto const &[rtl, value] = value_pair;
            // we don't put line number down for static variables
            // since we can't obtain them from Python
            auto *var_stmt = add_variable<true>(parent_scope, name, value, rtl);
            if (var_stmt && enable_conditions_.find(stmt) != enable_conditions_.end()) {
                var_stmt->condition = enable_conditions_.at(stmt);
            }
        }
        // add itself
        auto *stmt_scope = add_stmt(parent_scope, stmt, filename, ln);
        if (stmt_scope) {
            stmt_scope_mapping_.emplace(stmt, stmt_scope);
        }
    }